

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double get_kf_boost_score(AV1_COMP *cpi,double kf_raw_err,double *zero_motion_accumulator,
                         double *sr_accumulator,int use_avg_stat)

{
  int iVar1;
  int in_ECX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double zm_factor;
  double frame_boost;
  double kf_max_boost;
  double boost_score;
  int num_stat_used;
  int i;
  FIRSTPASS_STATS frame_stat;
  FRAME_INFO *frame_info;
  TWO_PASS *twopass;
  RATE_CONTROL *rc;
  FIRSTPASS_STATS *in_stack_fffffffffffffe78;
  TWO_PASS_FRAME *in_stack_fffffffffffffe80;
  TWO_PASS *in_stack_fffffffffffffe88;
  FIRSTPASS_STATS *local_168;
  FIRSTPASS_STATS *local_160;
  double local_158;
  FIRSTPASS_STATS *max_boost;
  double *sr_accumulator_00;
  int iVar4;
  int iVar5;
  FRAME_INFO *in_stack_fffffffffffffed8;
  PRIMARY_RATE_CONTROL *in_stack_fffffffffffffee0;
  double local_f8;
  double local_f0;
  FIRSTPASS_STATS *in_stack_ffffffffffffff70;
  AV1_COMP *in_stack_ffffffffffffff78;
  
  memset(&stack0xfffffffffffffed8,0,0xe8);
  iVar4 = 0;
  sr_accumulator_00 = (double *)0x0;
  if (*(int *)(in_RDI + 0x423dc) == 3) {
    if ((double)*(int *)(in_RDI + 0x6079c) * 2.0 <= 80.0) {
      local_158 = 80.0;
    }
    else {
      local_158 = (double)*(int *)(in_RDI + 0x6079c) * 2.0;
    }
    if (128.0 <= local_158) {
      local_168 = (FIRSTPASS_STATS *)0x4060000000000000;
    }
    else if ((double)*(int *)(in_RDI + 0x6079c) * 2.0 <= 80.0) {
      local_160 = (FIRSTPASS_STATS *)0x4054000000000000;
      local_168 = local_160;
    }
    else {
      local_168 = (FIRSTPASS_STATS *)((double)*(int *)(in_RDI + 0x6079c) * 2.0);
    }
  }
  else {
    local_168 = (FIRSTPASS_STATS *)0x4060000000000000;
  }
  max_boost = local_168;
  iVar5 = iVar4;
  if (in_ECX != 0) {
    iVar4 = calc_avg_stats(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    iVar5 = iVar4;
  }
  while ((iVar5 < *(int *)(in_RDI + 0x6079c) + -1 &&
         ((in_ECX != 0 ||
          (iVar1 = input_stats(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                               in_stack_fffffffffffffe78), iVar1 != -1))))) {
    if (iVar5 < 1) {
      *in_RSI = local_f8 - local_f0;
    }
    else {
      in_stack_fffffffffffffe88 = (TWO_PASS *)*in_RSI;
      dVar2 = get_zero_motion_factor(local_168);
      if (dVar2 <= (double)in_stack_fffffffffffffe88) {
        in_stack_fffffffffffffe80 = (TWO_PASS_FRAME *)get_zero_motion_factor(local_168);
      }
      else {
        in_stack_fffffffffffffe80 = (TWO_PASS_FRAME *)*in_RSI;
      }
      *in_RSI = (double)in_stack_fffffffffffffe80;
    }
    if ((*in_RDX < in_XMM0_Qa * 1.5) &&
       (iVar1 = *(int *)(in_RDI + 0x60794) * 2,
       iVar5 == iVar1 || SBORROW4(iVar5,iVar1) != iVar5 + *(int *)(in_RDI + 0x60794) * -2 < 0)) {
      dVar2 = *in_RSI;
      if (iVar5 < 2) {
        *in_RDX = 0.0;
      }
      dVar3 = calc_kf_frame_boost(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                  (FIRSTPASS_STATS *)CONCAT44(iVar5,iVar4),sr_accumulator_00,
                                  (double)max_boost);
      sr_accumulator_00 = (double *)(dVar3 * (dVar2 / 2.0 + 0.75) + (double)sr_accumulator_00);
    }
    iVar5 = iVar5 + 1;
  }
  return (double)sr_accumulator_00;
}

Assistant:

static double get_kf_boost_score(AV1_COMP *cpi, double kf_raw_err,
                                 double *zero_motion_accumulator,
                                 double *sr_accumulator, int use_avg_stat) {
  RATE_CONTROL *const rc = &cpi->rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  FIRSTPASS_STATS frame_stat;
  av1_zero(frame_stat);
  int i = 0, num_stat_used = 0;
  double boost_score = 0.0;
  const double kf_max_boost =
      cpi->oxcf.rc_cfg.mode == AOM_Q
          ? AOMMIN(AOMMAX(rc->frames_to_key * 2.0, KF_MIN_FRAME_BOOST),
                   KF_MAX_FRAME_BOOST)
          : KF_MAX_FRAME_BOOST;

  // Calculate the average using available number of stats.
  if (use_avg_stat) num_stat_used = calc_avg_stats(cpi, &frame_stat);

  for (i = num_stat_used; i < (rc->frames_to_key - 1); ++i) {
    if (!use_avg_stat &&
        EOF == input_stats(twopass, &cpi->twopass_frame, &frame_stat))
      break;

    // Monitor for static sections.
    // For the first frame in kf group, the second ref indicator is invalid.
    if (i > 0) {
      *zero_motion_accumulator =
          AOMMIN(*zero_motion_accumulator, get_zero_motion_factor(&frame_stat));
    } else {
      *zero_motion_accumulator = frame_stat.pcnt_inter - frame_stat.pcnt_motion;
    }

    // Not all frames in the group are necessarily used in calculating boost.
    if ((*sr_accumulator < (kf_raw_err * 1.50)) &&
        (i <= rc->max_gf_interval * 2)) {
      double frame_boost;
      double zm_factor;

      // Factor 0.75-1.25 based on how much of frame is static.
      zm_factor = (0.75 + (*zero_motion_accumulator / 2.0));

      if (i < 2) *sr_accumulator = 0.0;
      frame_boost =
          calc_kf_frame_boost(&cpi->ppi->p_rc, frame_info, &frame_stat,
                              sr_accumulator, kf_max_boost);
      boost_score += frame_boost * zm_factor;
    }
  }
  return boost_score;
}